

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__decode_uint8_srgb2_linearalpha(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  float *decode;
  float *pfVar2;
  float *pfVar3;
  
  pfVar1 = decodep + width_times_channels;
  pfVar2 = decodep;
  if (3 < width_times_channels) {
    do {
      *pfVar2 = stbir__srgb_uchar_to_linear_float[*inputp];
      pfVar2[1] = (float)*(byte *)((long)inputp + 1) * 0.003921569;
      pfVar2[2] = stbir__srgb_uchar_to_linear_float[*(byte *)((long)inputp + 2)];
      pfVar2[3] = (float)*(byte *)((long)inputp + 3) * 0.003921569;
      inputp = (void *)((long)inputp + 4);
      decodep = pfVar2 + 4;
      pfVar3 = pfVar2 + 8;
      pfVar2 = decodep;
    } while (pfVar3 <= pfVar1);
  }
  if (decodep < pfVar1) {
    *decodep = 0.0;
    decodep[1] = (float)*(byte *)((long)inputp + 1) * 0.003921569;
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint8_srgb2_linearalpha)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float const * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const *)inputp;
  decode += 4;
  while( decode <= decode_end )
  {
    decode[0-4] = stbir__srgb_uchar_to_linear_float[ input[stbir__decode_order0] ];
    decode[1-4] = ( (float) input[stbir__decode_order1] ) * stbir__max_uint8_as_float_inverted;
    decode[2-4] = stbir__srgb_uchar_to_linear_float[ input[stbir__decode_order0+2] ];
    decode[3-4] = ( (float) input[stbir__decode_order1+2] ) * stbir__max_uint8_as_float_inverted;
    input += 4;
    decode += 4;
  }
  decode -= 4;
  if( decode < decode_end )
  {
    decode[0] = stbir__srgb_uchar_to_linear_float[ stbir__decode_order0 ];
    decode[1] = ( (float) input[stbir__decode_order1] ) * stbir__max_uint8_as_float_inverted;
  }
}